

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O2

void __thiscall cppwinrt::writer::write_root_include(writer *this,string_view *include)

{
  char local_12;
  char local_11;
  string_view local_10;
  
  local_10._M_len = 0x15;
  local_11 = '<';
  if (settings[0xa8] == '\0') {
    local_11 = '\"';
  }
  local_10._M_str = "#include %winrt/%.h%\n";
  local_12 = '>';
  if (settings[0xa8] == '\0') {
    local_12 = '\"';
  }
  writer_base<cppwinrt::writer>::
  write_segment<char,std::basic_string_view<char,std::char_traits<char>>,char>
            (&this->super_writer_base<cppwinrt::writer>,&local_10,&local_11,include,&local_12);
  return;
}

Assistant:

void write_root_include(std::string_view const& include)
        {
            auto format = R"(#include %winrt/%.h%
)";

            write(format,
                settings.brackets ? '<' : '\"',
                include,
                settings.brackets ? '>' : '\"');
        }